

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::NewCovergroupExpression::visitExprs<slang::ast::NetAliasVisitor&>
          (NewCovergroupExpression *this,NetAliasVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  ppEVar1 = (this->arguments)._M_ptr;
  sVar2 = (this->arguments)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::NetAliasVisitor&>(*(Expression **)((long)ppEVar1 + lVar3),visitor)
    ;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto arg : arguments)
            arg->visit(visitor);
    }